

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

http_header * http_header::create(vm_val_t *lstval)

{
  int iVar1;
  ushort *puVar2;
  http_header *this;
  int iVar3;
  http_header **pphVar4;
  http_header *head;
  vm_val_t ele;
  
  pphVar4 = &head;
  head = (http_header *)0x0;
  iVar1 = vm_val_t::ll_length(lstval);
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  iVar1 = 1;
  while( true ) {
    if (iVar1 - iVar3 == 1) {
      return head;
    }
    vm_val_t::ll_index(lstval,&ele,iVar1);
    puVar2 = (ushort *)vm_val_t::get_as_string(&ele);
    if (puVar2 == (ushort *)0x0) break;
    this = (http_header *)operator_new(0x18);
    http_header(this,(char *)(puVar2 + 1),(ulong)*puVar2);
    *pphVar4 = this;
    pphVar4 = &this->nxt;
    iVar1 = iVar1 + 1;
  }
  err_throw(0x7e3);
}

Assistant:

static http_header *create(VMG_ const vm_val_t *lstval)
    {
        /* start with an empty list */
        http_header *head = 0, **tailp = &head;
        
        /* parse the value list */
        int cnt = lstval->ll_length(vmg0_);
        for (int i = 1 ; i <= cnt ; ++i)
        {
            /* get this list element */
            vm_val_t ele;
            lstval->ll_index(vmg_ &ele, i);
            
            /* it has to be a string */
            const char *h = ele.get_as_string(vmg0_);
            if (h == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* add a new header */
            *tailp = new http_header(h + VMB_LEN, vmb_get_len(h));
            tailp = &(*tailp)->nxt;
        }

        /* return the list head */
        return head;
    }